

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result * __thiscall
testing::internal::
FunctionMocker<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
::PerformDefaultAction
          (Result *__return_storage_ptr__,
          FunctionMocker<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
          *this,ArgumentTuple *args,string *call_description)

{
  bool bVar1;
  OnCallSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  *this_00;
  Action<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  *this_01;
  runtime_error *this_02;
  undefined1 local_58 [8];
  string message;
  OnCallSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  *spec;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMocker<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  *this_local;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 ==
      (OnCallSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
       *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    bVar1 = DefaultValue<ot::commissioner::Error>::Exists();
    if (!bVar1) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,(string *)local_58);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    DefaultValue<ot::commissioner::Error>::Get();
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    this_01 = OnCallSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
              ::GetAction(this_00);
    std::tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>::tuple
              ((tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&> *)
               ((long)&message.field_2 + 8),args);
    Action<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::Perform(__return_storage_ptr__,this_01,(ArgumentTuple *)((long)&message.field_2 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }